

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

string * __thiscall
project::get_source_groups_abi_cxx11_(string *__return_storage_ptr__,project *this)

{
  bool bVar1;
  const_iterator pxVar2;
  const_iterator pxVar3;
  ostream *poVar4;
  char_t *pcVar5;
  const_iterator pxVar6;
  xpath_node_set source_groups;
  xpath_node node_1;
  xpath_node_set sub_source;
  xpath_node node_2;
  xpath_node_set sources;
  stringstream ss;
  xpath_node node;
  xml_node local_400;
  xml_attribute local_3f8;
  xpath_node_set local_3f0;
  xpath_node local_3c8;
  xpath_node_set local_3b0;
  xpath_node local_388 [2];
  xpath_node_set local_368;
  stringstream local_340 [16];
  ostream local_330 [376];
  xpath_node local_1b8;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_340);
  pugi::xml_node::select_nodes
            (&local_368,(xml_node *)this,"/JUCERPROJECT/MAINGROUP/GROUP[@name = \'Source\']/FILE",
             (xpath_variable_set *)0x0);
  std::operator<<(local_330,"\nsource_group (Source FILES\n");
  pxVar2 = pugi::xpath_node_set::begin(&local_368);
  while( true ) {
    pxVar3 = pugi::xpath_node_set::end(&local_368);
    if (pxVar2 == pxVar3) break;
    local_1b8._node._root = (pxVar2->_node)._root;
    local_1b8._attribute._attr = (pxVar2->_attribute)._attr;
    local_3b0._0_8_ = pugi::xpath_node::node(&local_1b8);
    local_3f0._0_8_ = pugi::xml_node::attribute((xml_node *)&local_3b0,"resource");
    bVar1 = pugi::xml_attribute::as_bool((xml_attribute *)&local_3f0,false);
    if (!bVar1) {
      poVar4 = std::operator<<(local_330,"\n    ");
      local_3b0._0_8_ = pugi::xpath_node::node(&local_1b8);
      local_3f0._0_8_ = pugi::xml_node::attribute((xml_node *)&local_3b0,"file");
      pcVar5 = pugi::xml_attribute::value((xml_attribute *)&local_3f0);
      std::operator<<(poVar4,pcVar5);
    }
    pxVar2 = pxVar2 + 1;
  }
  std::operator<<(local_330,"\n");
  std::operator<<(local_330,")\n");
  pugi::xml_node::select_nodes
            (&local_3f0,(xml_node *)this,"/JUCERPROJECT/MAINGROUP/GROUP[@name = \'Source\']/GROUP",
             (xpath_variable_set *)0x0);
  pxVar2 = pugi::xpath_node_set::begin(&local_3f0);
  while( true ) {
    pxVar3 = pugi::xpath_node_set::end(&local_3f0);
    if (pxVar2 == pxVar3) break;
    local_3c8._node._root = (pxVar2->_node)._root;
    local_3c8._attribute._attr = (pxVar2->_attribute)._attr;
    poVar4 = std::operator<<(local_330,"\nsource_group (Source\\\\");
    local_3b0._0_8_ = pugi::xpath_node::node(&local_3c8);
    local_1b8._node._root =
         (xml_node_struct *)pugi::xml_node::attribute((xml_node *)&local_3b0,"name");
    pcVar5 = pugi::xml_attribute::value((xml_attribute *)&local_1b8);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4," FILES\n");
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    poVar4 = std::operator<<(local_1a8,"/JUCERPROJECT/MAINGROUP/GROUP/GROUP[@name = \'");
    local_388[0]._node = pugi::xpath_node::node(&local_3c8);
    local_3b0._0_8_ = pugi::xml_node::attribute(&local_388[0]._node,"name");
    pcVar5 = pugi::xml_attribute::value((xml_attribute *)&local_3b0);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\']/FILE");
    std::__cxx11::stringbuf::str();
    pugi::xml_node::select_nodes
              (&local_3b0,(xml_node *)this,(char_t *)local_388[0]._node._root,
               (xpath_variable_set *)0x0);
    std::__cxx11::string::~string((string *)local_388);
    pxVar3 = pugi::xpath_node_set::begin(&local_3b0);
    while( true ) {
      pxVar6 = pugi::xpath_node_set::end(&local_3b0);
      if (pxVar3 == pxVar6) break;
      local_388[0]._node._root = (pxVar3->_node)._root;
      local_388[0]._attribute._attr = (pxVar3->_attribute)._attr;
      poVar4 = std::operator<<(local_330,"\n    ");
      local_400 = pugi::xpath_node::node(local_388);
      local_3f8 = pugi::xml_node::attribute(&local_400,"file");
      pcVar5 = pugi::xml_attribute::value(&local_3f8);
      std::operator<<(poVar4,pcVar5);
      pxVar3 = pxVar3 + 1;
    }
    std::operator<<(local_330,"\n)\n");
    pugi::xpath_node_set::~xpath_node_set(&local_3b0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    pxVar2 = pxVar2 + 1;
  }
  std::operator<<(local_330,"\n");
  std::__cxx11::stringbuf::str();
  pugi::xpath_node_set::~xpath_node_set(&local_3f0);
  pugi::xpath_node_set::~xpath_node_set(&local_368);
  std::__cxx11::stringstream::~stringstream(local_340);
  return __return_storage_ptr__;
}

Assistant:

std::string project::get_source_groups()
{
    std::stringstream ss;

    pugi::xpath_node_set sources = m_Doc.select_nodes("/JUCERPROJECT/MAINGROUP/GROUP[@name = 'Source']/FILE");
    ss << "\nsource_group (Source FILES\n";
    for (pugi::xpath_node_set::const_iterator it = sources.begin(); it != sources.end(); ++it)
    {
        pugi::xpath_node node = *it;
        if(!node.node().attribute("resource").as_bool()) {
            ss << "\n    " << node.node().attribute("file").value();
        }
    }
    ss << "\n";
    ss << ")\n";

    pugi::xpath_node_set source_groups = m_Doc.select_nodes("/JUCERPROJECT/MAINGROUP/GROUP[@name = 'Source']/GROUP");
    for (pugi::xpath_node_set::const_iterator it = source_groups.begin(); it != source_groups.end(); ++it)
    {
        pugi::xpath_node node = *it;
        ss << "\nsource_group (Source\\\\" << node.node().attribute("name").value() << " FILES\n";

        std::stringstream q;
        q << "/JUCERPROJECT/MAINGROUP/GROUP/GROUP[@name = '" << node.node().attribute("name").value() << "']/FILE";
        pugi::xpath_node_set sub_source = m_Doc.select_nodes(q.str().c_str());
        for (pugi::xpath_node_set::const_iterator it = sub_source.begin(); it != sub_source.end(); ++it)
        {
            pugi::xpath_node node = *it;
            ss << "\n    " << node.node().attribute("file").value();
        }
        ss << "\n)\n";
    }
    ss << "\n";

    return ss.str();
}